

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_spot_values.cpp
# Opt level: O2

bool from_issue_429::test_uintwide_t_spot_values_from_issue_429(void)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  allocator_type local_241;
  vector<unsigned_char,_std::allocator<unsigned_char>_> input;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_228;
  vector<unsigned_char,_std::allocator<unsigned_char>_> export_local;
  local_uint_type p0_local;
  string str_local;
  uchar local_1b8 [32];
  stringstream strm_local;
  basic_ostream<char,_std::char_traits<char>_> local_188;
  undefined7 uStack_187;
  uint auStack_170 [88];
  
  _strm_local = 0xffffffffff000000;
  local_188 = (basic_ostream<char,_std::char_traits<char>_>)0x21;
  __l._M_len = 0x11;
  __l._M_array = (iterator)&strm_local;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&input,__l,(allocator_type *)&p0_local);
  p0_local.values.super_array<unsigned_int,_8UL>.elems[4] = 0;
  p0_local.values.super_array<unsigned_int,_8UL>.elems[5] = 0;
  p0_local.values.super_array<unsigned_int,_8UL>.elems[6] = 0;
  p0_local.values.super_array<unsigned_int,_8UL>.elems[7] = 0;
  p0_local.values.super_array<unsigned_int,_8UL>.elems[0] = 0;
  p0_local.values.super_array<unsigned_int,_8UL>.elems[1] = 0;
  p0_local.values.super_array<unsigned_int,_8UL>.elems[2] = 0;
  p0_local.values.super_array<unsigned_int,_8UL>.elems[3] = 0;
  math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_false>::uintwide_t(&p0_local);
  math::wide_integer::
  import_bits<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_256U,_unsigned_int,_void,_nullptr>
            (&p0_local,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,8,true);
  std::__cxx11::stringstream::stringstream((stringstream *)&strm_local);
  lVar1 = *(long *)(CONCAT71(uStack_187,local_188) + -0x18);
  *(uint *)((long)auStack_170 + lVar1) = *(uint *)((long)auStack_170 + lVar1) & 0xffffffb5 | 8;
  math::wide_integer::operator<<(&local_188,&p0_local);
  std::__cxx11::stringbuf::str();
  bVar2 = std::operator==(&str_local,"ffffffffffffff2162ffffffff21");
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&export_local,
             (long)input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,(allocator_type *)&local_228);
  math::wide_integer::
  export_bits<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_256U,_unsigned_int,_void,_false,_nullptr>
            (&p0_local,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )export_local.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,8,true);
  local_1b8[0] = 0xff;
  local_1b8[1] = 0xff;
  local_1b8[2] = 0xff;
  local_1b8[3] = 0xff;
  local_1b8[4] = 0xff;
  local_1b8[5] = 0xff;
  local_1b8[6] = 0xff;
  local_1b8[7] = '!';
  local_1b8[8] = 'b';
  local_1b8[9] = 0xff;
  local_1b8[10] = 0xff;
  local_1b8[0xb] = 0xff;
  local_1b8[0xc] = 0xff;
  local_1b8[0xd] = '!';
  local_1b8[0xe] = '\0';
  local_1b8[0xf] = '\0';
  local_1b8[0x10] = 0;
  __l_00._M_len = 0x11;
  __l_00._M_array = local_1b8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_228,__l_00,&local_241);
  bVar3 = std::operator==(&export_local,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_228);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_228);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&export_local.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::~string((string *)&str_local);
  std::__cxx11::stringstream::~stringstream((stringstream *)&strm_local);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&input.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar2 && bVar3;
}

Assistant:

auto test_uintwide_t_spot_values_from_issue_429() -> bool
  {
    #if defined(WIDE_INTEGER_NAMESPACE)
    using local_uint_type = WIDE_INTEGER_NAMESPACE::math::wide_integer::uint256_t;
    #else
    using local_uint_type = ::math::wide_integer::uint256_t;
    #endif

    const std::vector<std::uint8_t>
      input
      (
        {
          0x00, 0x00, 0x00, 0xff,
          0xff, 0xff, 0xff, 0xff,
          0xff, 0xff, 0x21, 0x62,
          0xff, 0xff, 0xff, 0xff,
          0x21
        }
    );

    local_uint_type p0_local { };

    // Import the data into the wide integer.
    import_bits
    (
      p0_local,
      input.cbegin(),
      input.cend(),
      static_cast<unsigned>(UINT8_C(8))
    );

    std::stringstream strm_local { };

    strm_local << std::hex << p0_local;

    const std::string str_local { strm_local.str() };

    const bool result_import_is_ok { str_local == "ffffffffffffff2162ffffffff21" };

    std::vector<std::uint8_t> export_local(input.size());

    export_bits(p0_local, export_local.begin(), static_cast<unsigned>(UINT8_C(8)));

    const bool result_export_is_ok
    {
      export_local == std::vector<std::uint8_t>( { 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0x21, 0x62, 0xff, 0xff, 0xff, 0xff, 0x21, 0x00, 0x00, 0x00 } )
    };

    const bool result_import_export_is_ok { result_import_is_ok && result_export_is_ok };

    return result_import_export_is_ok;
  }